

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.h
# Opt level: O2

State * __thiscall
MultiAgentDecisionProcessDiscrete::GetState(MultiAgentDecisionProcessDiscrete *this,Index i)

{
  const_reference pvVar1;
  
  pvVar1 = std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::at
                     ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)(this + 0xe0),
                      (ulong)i);
  return (State *)pvVar1;
}

Assistant:

const State* GetState(Index i) const 
            {return(&_m_stateVec.at(i)); }